

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O3

void __thiscall LinearExpert::m_step(LinearExpert *this)

{
  Z *pZVar1;
  XZ *this_00;
  X *pXVar2;
  Z *lhs;
  ZZ *pZVar3;
  double *pdVar4;
  double **ppdVar5;
  Z *this_01;
  double *pdVar6;
  double dVar7;
  double *pdVar8;
  Scalar SVar9;
  undefined8 *puVar10;
  Index index;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  Index index_3;
  long lVar14;
  undefined8 uVar15;
  ulong uVar16;
  double *pdVar17;
  ActualDstType actualDst_1;
  Index dstRows_2;
  Index *pIVar18;
  long lVar19;
  ActualDstType actualDst;
  Index othersize;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Z meanZ;
  X meanX;
  ZZ zz;
  DstEvaluatorType dstEvaluator;
  ThisEvaluator thisEval;
  XZ xz;
  add_assign_op<double,_double> local_129;
  Scal local_128;
  undefined8 uStack_120;
  undefined1 local_118 [24];
  ulong uStack_100;
  DenseStorage<double,__1,__1,__1,_0> local_f0;
  plainobjectbase_evaluator_data<double,_0> local_d8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_d0;
  undefined1 local_b0 [8];
  Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  plainobjectbase_evaluator_data<double,_0> local_a0;
  scalar_constant_op<double> local_98;
  evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_90;
  plainobjectbase_evaluator_data<double,_0> local_88;
  Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_80;
  XZ *local_78;
  char local_70;
  DenseStorage<double,__1,__1,__1,_0> local_60;
  double local_48;
  undefined8 uStack_40;
  
  uVar16 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  local_128 = this->Sh;
  uStack_120 = 0;
  local_118._0_8_ = (double *)0x0;
  local_118._8_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_118,uVar16,1);
  lhs = &this->Sz;
  pdVar13 = (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (local_118._8_8_ != uVar16) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_118,uVar16,1);
    uVar16 = local_118._8_8_;
  }
  uVar11 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar16) {
    lVar14 = 0;
    do {
      auVar22._8_4_ = SUB84(local_128,0);
      auVar22._0_8_ = local_128;
      auVar22._12_4_ = (int)((ulong)local_128 >> 0x20);
      auVar22 = divpd(*(undefined1 (*) [16])(pdVar13 + lVar14),auVar22);
      *(undefined1 (*) [16])(local_118._0_8_ + lVar14 * 8) = auVar22;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar16) {
    do {
      *(double *)(local_118._0_8_ + uVar11 * 8) = pdVar13[uVar11] / local_128;
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
  }
  uVar16 = (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  local_128 = this->Sh;
  uStack_120 = 0;
  this_01 = (Z *)(local_118 + 0x10);
  local_118._16_8_ = (RhsNested)0x0;
  uStack_100 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_01,uVar16,1);
  pdVar13 = (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  if (uStack_100 != uVar16) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_118 + 0x10),uVar16
               ,1);
    uVar16 = uStack_100;
  }
  uVar15 = local_118._0_8_;
  uVar11 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar16) {
    lVar14 = 0;
    do {
      auVar27._8_4_ = SUB84(local_128,0);
      auVar27._0_8_ = local_128;
      auVar27._12_4_ = (int)((ulong)local_128 >> 0x20);
      auVar22 = divpd(*(undefined1 (*) [16])(pdVar13 + lVar14),auVar27);
      *(undefined1 (*) [16])
       (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_118._16_8_)->m_storage)
         .m_data + lVar14) = auVar22;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar16) {
    do {
      (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_118._16_8_)->m_storage).
        m_data)[uVar11] = (double *)(pdVar13[uVar11] / local_128);
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
  }
  dVar7 = this->wNu;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    uStack_120 = 0;
    local_48 = this->Sh + dVar7;
    uStack_40 = 0;
    uVar16 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    pZVar1 = &this->Nu;
    pdVar13 = (this->Nu0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    pdVar17 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    local_128 = dVar7;
    if ((this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != uVar16) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar16,1);
      uVar16 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
    }
    pdVar8 = (pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar11 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar16) {
      auVar24._8_8_ = local_48;
      auVar24._0_8_ = local_48;
      lVar14 = 0;
      do {
        pdVar4 = pdVar13 + lVar14;
        pdVar6 = pdVar17 + lVar14;
        auVar28._0_8_ = *pdVar4 * local_128 + *pdVar6;
        auVar28._8_8_ = pdVar4[1] * local_128 + pdVar6[1];
        auVar22 = divpd(auVar28,auVar24);
        *(undefined1 (*) [16])(pdVar8 + lVar14) = auVar22;
        lVar14 = lVar14 + 2;
      } while (lVar14 < (long)uVar11);
    }
    if ((long)uVar11 < (long)uVar16) {
      do {
        pdVar8[uVar11] = (pdVar13[uVar11] * local_128 + pdVar17[uVar11]) / local_48;
        uVar11 = uVar11 + 1;
      } while (uVar16 != uVar11);
    }
    pZVar3 = &this->Sigma;
    pdVar13 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
              .m_data;
    lVar14 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
    lVar12 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
    if (((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows != lVar14) ||
       ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols != lVar12)) {
      if ((lVar12 != 0 && lVar14 != 0) &&
         (auVar22 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
         uVar15 = SUB168(auVar22 % SEXT816(lVar12),0), SUB168(auVar22 / SEXT816(lVar12),0) < lVar14)
         ) goto LAB_001520b3;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)pZVar3,lVar12 * lVar14,lVar14,lVar12);
      lVar14 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      lVar12 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
    }
    lVar12 = lVar12 * lVar14;
    pdVar17 = (pZVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_data;
    uVar16 = lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar12) {
      lVar14 = 0;
      do {
        pdVar8 = pdVar13 + lVar14;
        dVar7 = pdVar8[1];
        pdVar4 = pdVar17 + lVar14;
        *pdVar4 = *pdVar8;
        pdVar4[1] = dVar7;
        lVar14 = lVar14 + 2;
      } while (lVar14 < (long)uVar16);
    }
    if ((long)uVar16 < lVar12) {
      do {
        pdVar17[uVar16] = pdVar13[uVar16];
        uVar16 = uVar16 + 1;
      } while (lVar12 - uVar16 != 0);
    }
    local_90.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)&this->Nu0;
    lVar14 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    lVar12 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    if (lVar14 <= lVar12) {
      lVar12 = lVar14;
    }
    if (0 < lVar12) {
      dVar7 = this->wSigma;
      pdVar13 = (this->mixture->Sigma).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar17 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar19 = 0;
      do {
        *pdVar17 = pdVar13[lVar19] * dVar7 + *pdVar17;
        lVar19 = lVar19 + 1;
        pdVar17 = pdVar17 + lVar14 + 1;
      } while (lVar12 != lVar19);
    }
    local_a8.m_matrix =
         (non_const_type)
         (this->Nu0).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
    ;
    local_98.m_other = this->wNu;
    local_80.m_matrix =
         (non_const_type)
         local_90.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data;
    Eigen::internal::
    outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::DenseShape,Eigen::DenseShape,5>::add>
              (pZVar3,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_b0,&local_80,(add *)&local_d0,(false_type *)&local_f0);
    local_98.m_other = this->wNu + this->Sh;
    local_a8.m_matrix =
         (non_const_type)
         (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_90.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)pZVar1;
    local_80.m_matrix = pZVar1;
    Eigen::internal::
    outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
              (pZVar3,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_b0,&local_80,(sub *)&local_d0,(false_type *)&local_f0);
    dVar7 = (double)this->d + this->Sh + this->wSigma + 2.0;
    pdVar13 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    lVar14 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols *
             (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    uVar16 = lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar14) {
      auVar25._8_8_ = dVar7;
      auVar25._0_8_ = dVar7;
      lVar12 = 0;
      do {
        auVar22 = divpd(*(undefined1 (*) [16])(pdVar13 + lVar12),auVar25);
        *(undefined1 (*) [16])(pdVar13 + lVar12) = auVar22;
        lVar12 = lVar12 + 2;
      } while (lVar12 < (long)uVar16);
    }
    if ((long)uVar16 < lVar14) {
      do {
        pdVar13[uVar16] = pdVar13[uVar16] / dVar7;
        uVar16 = uVar16 + 1;
      } while (lVar14 - uVar16 != 0);
    }
  }
  else {
    pZVar1 = &this->Nu;
    uVar16 = local_118._8_8_;
    if ((this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != local_118._8_8_) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 local_118._8_8_,1);
      uVar16 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
    }
    pdVar13 = (pZVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    uVar11 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar16) {
      lVar14 = 0;
      do {
        pdVar17 = (double *)(uVar15 + lVar14 * 8);
        dVar7 = pdVar17[1];
        pdVar8 = pdVar13 + lVar14;
        *pdVar8 = *pdVar17;
        pdVar8[1] = dVar7;
        lVar14 = lVar14 + 2;
      } while (lVar14 < (long)uVar11);
    }
    if ((long)uVar11 < (long)uVar16) {
      do {
        pdVar13[uVar11] = *(double *)(uVar15 + uVar11 * 8);
        uVar11 = uVar11 + 1;
      } while (uVar16 != uVar11);
    }
    pZVar3 = &this->Sigma;
    pdVar13 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
              .m_data;
    lVar14 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
    lVar12 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
    if (((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows != lVar14) ||
       ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols != lVar12)) {
      if ((lVar12 != 0 && lVar14 != 0) &&
         (auVar22 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
         uVar15 = SUB168(auVar22 % SEXT816(lVar12),0), SUB168(auVar22 / SEXT816(lVar12),0) < lVar14)
         ) {
LAB_001520b3:
        puVar10 = (undefined8 *)__cxa_allocate_exception(8,uVar16,uVar15);
        *puVar10 = operator_delete;
        __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)pZVar3,lVar12 * lVar14,lVar14,lVar12);
      lVar14 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      lVar12 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
    }
    lVar12 = lVar12 * lVar14;
    pdVar17 = (pZVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_data;
    uVar16 = lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar12) {
      lVar14 = 0;
      do {
        pdVar8 = pdVar13 + lVar14;
        dVar7 = pdVar8[1];
        pdVar4 = pdVar17 + lVar14;
        *pdVar4 = *pdVar8;
        pdVar4[1] = dVar7;
        lVar14 = lVar14 + 2;
      } while (lVar14 < (long)uVar16);
    }
    if ((long)uVar16 < lVar12) {
      do {
        pdVar17[uVar16] = pdVar13[uVar16];
        uVar16 = uVar16 + 1;
      } while (lVar12 - uVar16 != 0);
    }
    lVar14 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    lVar12 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    if (lVar14 <= lVar12) {
      lVar12 = lVar14;
    }
    if (0 < lVar12) {
      dVar7 = this->wSigma;
      pdVar13 = (this->mixture->Sigma).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar17 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar19 = 0;
      do {
        *pdVar17 = pdVar13[lVar19] * dVar7 + *pdVar17;
        lVar19 = lVar19 + 1;
        pdVar17 = pdVar17 + lVar14 + 1;
      } while (lVar12 != lVar19);
    }
    local_b0 = (undefined1  [8])lhs;
    local_a8.m_matrix = pZVar1;
    Eigen::internal::
    outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
              (pZVar3,lhs,&local_a8,(sub *)&local_d0,(false_type *)&local_f0);
    dVar7 = (double)this->d + this->Sh + this->wSigma + 1.0;
    pdVar13 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    lVar14 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols *
             (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    uVar16 = lVar14 - (lVar14 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar14) {
      auVar23._8_8_ = dVar7;
      auVar23._0_8_ = dVar7;
      lVar12 = 0;
      do {
        auVar22 = divpd(*(undefined1 (*) [16])(pdVar13 + lVar12),auVar23);
        *(undefined1 (*) [16])(pdVar13 + lVar12) = auVar22;
        lVar12 = lVar12 + 2;
      } while (lVar12 < (long)uVar16);
    }
    if ((long)uVar16 < lVar14) {
      do {
        pdVar13[uVar16] = pdVar13[uVar16] / dVar7;
        uVar16 = uVar16 + 1;
      } while (lVar14 - uVar16 != 0);
    }
  }
  local_b0 = (undefined1  [8])&this->Sigma;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&this->invSigma,(SrcXprType *)local_b0,(assign_op<double,_double> *)&local_d0);
  if ((this->invSigma).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows == 0) {
    uVar20 = 0;
    uVar21 = 0x3ff00000;
  }
  else {
    Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_b0,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->invSigma);
    if ((long)local_a8.m_matrix <= (long)local_a0.data) {
      local_a0.data = (double *)local_a8.m_matrix;
    }
    if ((Z *)local_a0.data == (Z *)0x0) {
      pdVar13 = (double *)0x3ff0000000000000;
    }
    else {
      pdVar13 = (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b0)->m_storage
                ).m_data;
      if (1 < (long)local_a0.data) {
        lVar14 = (long)local_a0.data + -0x10 + 0xf;
        pIVar18 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b0)->
                   m_storage).m_rows + (long)local_a8.m_matrix;
        do {
          pdVar13 = (double *)((double)pdVar13 * (double)*pIVar18);
          pIVar18 = pIVar18 + (long)((long)&((local_a8.m_matrix)->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            ).m_storage.m_data + 1);
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
    }
    local_128 = (double)(int)local_70 * (double)pdVar13;
    free(local_88.data);
    free((void *)local_98.m_other);
    free((void *)local_b0);
    uVar20 = SUB84(local_128,0);
    uVar21 = (undefined4)((ulong)local_128 >> 0x20);
  }
  if ((double)CONCAT44(uVar21,uVar20) < 0.0) {
    dVar7 = sqrt((double)CONCAT44(uVar21,uVar20));
  }
  else {
    dVar7 = SQRT((double)CONCAT44(uVar21,uVar20));
  }
  this->sqrtDetInvSigma = dVar7;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_f0,(DenseStorage<double,__1,__1,__1,_0> *)&this->Szz);
  if (local_f0.m_rows <= local_f0.m_cols) {
    local_f0.m_cols = local_f0.m_rows;
  }
  if (0 < local_f0.m_cols) {
    dVar7 = this->wLambda;
    pdVar13 = local_f0.m_data;
    do {
      *pdVar13 = *pdVar13 + dVar7;
      pdVar13 = pdVar13 + local_f0.m_rows + 1;
      local_f0.m_cols = local_f0.m_cols + -1;
    } while (local_f0.m_cols != 0);
  }
  local_b0 = (undefined1  [8])local_118;
  local_a8.m_matrix = lhs;
  Eigen::internal::
  outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_f0,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_b0,&local_a8,(sub *)&local_d0,
             (false_type *)&local_60);
  local_b0 = (undefined1  [8])&local_f0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&this->varLambda,(SrcXprType *)local_b0,(assign_op<double,_double> *)&local_d0);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_60,(DenseStorage<double,__1,__1,__1,_0> *)&this->Sxz);
  local_b0 = (undefined1  [8])this_01;
  local_a8.m_matrix = lhs;
  Eigen::internal::
  outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_60,this_01,&local_a8,(sub *)&local_d0,
             (false_type *)&local_d8);
  this_00 = &this->Lambda;
  lVar14 = (this->varLambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols;
  if (((this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_rows != local_60.m_rows) ||
     ((this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols != lVar14)) {
    if ((lVar14 != 0 && local_60.m_rows != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar14),0) <
        local_60.m_rows)) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = operator_delete;
      __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)this_00,lVar14 * local_60.m_rows,
               local_60.m_rows,lVar14);
  }
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (this_00,(Matrix<double,__1,__1,_0,__1,__1> *)&local_60,&this->varLambda);
  uVar15 = local_118._16_8_;
  pXVar2 = &this->Mu;
  uVar16 = uStack_100;
  if ((this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      uStack_100) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pXVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uStack_100,1)
    ;
    uVar16 = (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
  }
  pdVar13 = (pXVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  uVar11 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar16) {
    lVar14 = 0;
    do {
      ppdVar5 = &(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)uVar15)->m_storage).
                 m_data + lVar14;
      dVar7 = (double)ppdVar5[1];
      pdVar17 = pdVar13 + lVar14;
      *pdVar17 = (double)*ppdVar5;
      pdVar17[1] = dVar7;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar16) {
    do {
      pdVar13[uVar11] =
           (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)uVar15)->
                     m_storage).m_data)[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
  }
  local_d0.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
  if ((this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows == 1) {
    if (local_118._8_8_ == 0) {
      dVar7 = 0.0;
    }
    else {
      pdVar13 = (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
      pdVar17 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_data;
      dVar7 = (*pdVar13 - *(double *)local_118._0_8_) * *pdVar17;
      if (1 < (long)local_118._8_8_) {
        uVar16 = 1;
        do {
          dVar7 = dVar7 + (pdVar13[uVar16] - *(double *)(local_118._0_8_ + uVar16 * 8)) *
                          pdVar17[uVar16];
          uVar16 = uVar16 + 1;
        } while (local_118._8_8_ != uVar16);
      }
    }
    pdVar13 = (pXVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    *pdVar13 = dVar7 + *pdVar13;
  }
  else {
    local_a8.m_matrix = (non_const_type)local_118;
    local_b0 = (undefined1  [8])&this->Nu;
    Eigen::internal::gemv_dense_selector<2,0,true>::
    run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (this_00,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_b0,pXVar2,(Scalar *)&local_d0);
  }
  local_128 = this->wPsi;
  uStack_120 = 0;
  pXVar2 = &this->Psi;
  pdVar13 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data;
  uVar16 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      uVar16) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pXVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar16,1);
    uVar16 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
  }
  pdVar17 = (pXVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  uVar11 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar16) {
    lVar14 = 0;
    do {
      pdVar8 = pdVar13 + lVar14;
      dVar7 = pdVar8[1];
      pdVar4 = pdVar17 + lVar14;
      *pdVar4 = *pdVar8 * local_128;
      pdVar4[1] = dVar7 * local_128;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar16) {
    do {
      pdVar17[uVar11] = pdVar13[uVar11] * local_128;
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
  }
  local_a0.data =
       (this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_90.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
       (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
       (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)local_118._16_8_;
  local_88.data =
       (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_d8.data =
       (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_d0.m_dst = (DstEvaluatorType *)&local_d8;
  local_d0.m_functor = &local_129;
  local_d0.m_src = (SrcEvaluatorType *)local_b0;
  local_d0.m_dstExpr = pXVar2;
  local_80.m_matrix = (non_const_type)&local_60;
  local_78 = this_00;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::member_sum<double,_double>,_1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_3,_0>
  ::run(&local_d0);
  dVar7 = this->wPsi + this->Sh + 2.0;
  pdVar13 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar16 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar11 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar16) {
    auVar26._8_8_ = dVar7;
    auVar26._0_8_ = dVar7;
    lVar14 = 0;
    do {
      auVar22 = divpd(*(undefined1 (*) [16])(pdVar13 + lVar14),auVar26);
      *(undefined1 (*) [16])(pdVar13 + lVar14) = auVar22;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar16) {
    do {
      pdVar13[uVar11] = pdVar13[uVar11] / dVar7;
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
  }
  pXVar2 = &this->invPsi;
  pdVar13 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar16 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  if ((this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != uVar16) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pXVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar16,1);
    uVar16 = (this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_rows;
  }
  auVar22 = _DAT_0018bd00;
  pdVar17 = (pXVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  uVar11 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar16) {
    lVar14 = 0;
    do {
      auVar27 = divpd(auVar22,*(undefined1 (*) [16])(pdVar13 + lVar14));
      *(undefined1 (*) [16])(pdVar17 + lVar14) = auVar27;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar16) {
    do {
      pdVar17[uVar11] = 1.0 / pdVar13[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar16 != uVar11);
  }
  if ((this->invPsi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      == 0) {
    uVar20 = 0;
    uVar21 = 0x3ff00000;
  }
  else {
    local_b0 = (undefined1  [8])
               (pXVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
    SVar9 = Eigen::internal::
            redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
            ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                      ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b0,
                       (scalar_product_op<double,_double> *)&local_d0,pXVar2);
    uVar20 = SUB84(SVar9,0);
    uVar21 = (undefined4)((ulong)SVar9 >> 0x20);
  }
  if ((double)CONCAT44(uVar21,uVar20) < 0.0) {
    dVar7 = sqrt((double)CONCAT44(uVar21,uVar20));
  }
  else {
    dVar7 = SQRT((double)CONCAT44(uVar21,uVar20));
  }
  this->sqrtDetInvPsi = dVar7;
  this->recompute = true;
  free(local_60.m_data);
  free(local_f0.m_data);
  free((void *)local_118._16_8_);
  free((void *)local_118._0_8_);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void LINEAR_EXPERT_base::m_step()
{
    Z meanZ = Sz / Sh;
    X meanX = Sx / Sh;

    if( wNu == 0.0 )
    {
        Nu = meanZ;
        Sigma = Szz;
        Sigma += (wSigma*mixture->getSigma()).asDiagonal();
        Sigma.noalias() -= Sz*Nu.transpose();
        Sigma /= (Sh + wSigma + d + 1.0);
    }
    else
    {
        Nu = (wNu * Nu0 + Sz) / (wNu + Sh);
        Sigma = Szz;
        Sigma += (wSigma*mixture->getSigma()).asDiagonal();
        Sigma.noalias() += (wNu*Nu0)*Nu0.transpose();
        Sigma.noalias() -= ((wNu+Sh)*Nu)*Nu.transpose();
        Sigma /= (Sh + wSigma + d + 2.0);
    }
	invSigma = Sigma.inverse();
    sqrtDetInvSigma = sqrt(invSigma.determinant());

    ZZ zz = Szz;
    zz += (wLambda * Z::Ones(d)).asDiagonal();
    zz.noalias() -= meanZ*Sz.transpose();
    varLambda = zz.inverse();
    XZ xz = Sxz;
    xz.noalias() -= meanX*Sz.transpose();
    Lambda.noalias() = xz * varLambda;
    Mu = meanX;
    Mu.noalias() += Lambda * (Nu - meanZ);

    Psi = wPsi * mixture->getPsi();
    Psi.noalias() += Sxx - meanX.cwiseProduct(Sx) - xz.cwiseProduct(Lambda).rowwise().sum();
    Psi /= (wPsi + Sh + 2.0 );
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());

    recompute = true;
}